

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Octree.hpp
# Opt level: O0

Octant * __thiscall
unibn::Octree<Point3f,_std::vector<Point3f,_std::allocator<Point3f>_>_>::createOctant
          (Octree<Point3f,_std::vector<Point3f,_std::allocator<Point3f>_>_> *this,float x,float y,
          float z,float extent,uint32_t startIdx,uint32_t endIdx,uint32_t size)

{
  value_type vVar1;
  bool bVar2;
  Octant *pOVar3;
  reference pvVar4;
  float *pfVar5;
  Octant *pOVar6;
  uint in_ECX;
  float in_EDX;
  float in_ESI;
  uint *in_RDI;
  float in_XMM0_Da;
  float fVar7;
  float in_XMM1_Da;
  float in_XMM2_Da;
  float in_XMM3_Da;
  float childZ;
  float childY;
  float childX;
  uint32_t i_1;
  uint32_t lastChildIdx;
  bool firsttime;
  float childExtent;
  uint32_t mortonCode;
  Point3f *p;
  uint32_t i;
  uint32_t idx;
  vector<unsigned_int,_std::allocator<unsigned_int>_> childSizes;
  vector<unsigned_int,_std::allocator<unsigned_int>_> childEnds;
  vector<unsigned_int,_std::allocator<unsigned_int>_> childStarts;
  vector<Point3f,_std::allocator<Point3f>_> *points;
  Octant *octant;
  undefined4 in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffebc;
  float in_stack_fffffffffffffec0;
  float in_stack_fffffffffffffec4;
  undefined4 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffed0;
  uint local_cc;
  uint local_c8;
  uint local_bc;
  uint local_b0;
  float local_ac;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_a0;
  undefined4 local_84;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_80;
  undefined4 local_64;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_60;
  vector<Point3f,_std::allocator<Point3f>_> *local_48;
  uint32_t in_stack_ffffffffffffffd8;
  float z_00;
  
  pOVar3 = (Octant *)operator_new(0x60);
  Octant::Octant((Octant *)0x11327f);
  pOVar3->isLeaf = true;
  pOVar3->x = in_XMM0_Da;
  pOVar3->y = in_XMM1_Da;
  pOVar3->z = in_XMM2_Da;
  pOVar3->extent = in_XMM3_Da;
  pOVar3->start = (uint32_t)in_ESI;
  pOVar3->end = (uint32_t)in_EDX;
  pOVar3->size = in_ECX;
  if ((*in_RDI < in_ECX) && ((float)in_RDI[2] * 2.0 < in_XMM3_Da)) {
    pOVar3->isLeaf = false;
    local_48 = *(vector<Point3f,_std::allocator<Point3f>_> **)(in_RDI + 6);
    local_64 = 0;
    std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x113398);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (in_stack_fffffffffffffed0,
               CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
               (value_type_conflict *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
               (allocator_type *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x1133c6);
    local_84 = 0;
    std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x1133e3);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (in_stack_fffffffffffffed0,
               CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
               (value_type_conflict *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
               (allocator_type *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x113411);
    std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x11342e);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (in_stack_fffffffffffffed0,
               CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
               (value_type_conflict *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
               (allocator_type *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    local_ac = in_ESI;
    std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x11345c);
    z_00 = local_ac;
    for (local_b0 = 0; local_b0 < in_ECX; local_b0 = local_b0 + 1) {
      std::vector<Point3f,_std::allocator<Point3f>_>::operator[](local_48,(ulong)(uint)local_ac);
      fVar7 = get<0,Point3f>((Point3f *)0x1134bf);
      local_bc = (uint)(in_XMM0_Da < fVar7);
      fVar7 = get<1,Point3f>((Point3f *)0x1135be);
      if (in_XMM1_Da < fVar7) {
        local_bc = local_bc | 2;
      }
      fVar7 = get<2,Point3f>((Point3f *)0x1135f4);
      if (in_XMM2_Da < fVar7) {
        local_bc = local_bc | 4;
      }
      pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&local_a0,(ulong)local_bc);
      if (*pvVar4 == 0) {
        pfVar5 = (float *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                    (&local_60,(ulong)local_bc);
        *pfVar5 = local_ac;
      }
      else {
        pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (&local_80,(ulong)local_bc);
        pfVar5 = (float *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                     (in_RDI + 8),(ulong)*pvVar4);
        *pfVar5 = local_ac;
      }
      pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&local_a0,(ulong)local_bc);
      *pvVar4 = *pvVar4 + 1;
      pfVar5 = (float *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                  (&local_80,(ulong)local_bc);
      *pfVar5 = local_ac;
      pfVar5 = (float *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                   (in_RDI + 8),(ulong)(uint)local_ac);
      local_ac = *pfVar5;
    }
    fVar7 = in_XMM3_Da * 0.5;
    bVar2 = true;
    local_c8 = 0;
    for (local_cc = 0; local_cc < 8; local_cc = local_cc + 1) {
      pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&local_a0,(ulong)local_cc);
      if (*pvVar4 != 0) {
        in_stack_fffffffffffffec0 =
             *(float *)((long)createOctant::factor + (ulong)(local_cc & 4)) * in_XMM3_Da +
             in_XMM2_Da;
        in_stack_fffffffffffffec4 = fVar7;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                  (&local_60,(ulong)local_cc);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                  (&local_80,(ulong)local_cc);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                  (&local_a0,(ulong)local_cc);
        pOVar6 = createOctant((Octree<Point3f,_std::vector<Point3f,_std::allocator<Point3f>_>_> *)
                              CONCAT44(in_XMM0_Da,in_XMM1_Da),in_XMM2_Da,in_XMM3_Da,z_00,in_EDX,
                              in_ECX,in_stack_ffffffffffffffd8,(uint32_t)((ulong)pOVar3 >> 0x20));
        pOVar3->child[local_cc] = pOVar6;
        if (bVar2) {
          pOVar3->start = pOVar3->child[local_cc]->start;
        }
        else {
          vVar1 = pOVar3->child[local_cc]->start;
          pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 8),
                              (ulong)pOVar3->child[local_c8]->end);
          *pvVar4 = vVar1;
        }
        local_c8 = local_cc;
        pOVar3->end = pOVar3->child[local_cc]->end;
        bVar2 = false;
      }
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
  }
  return pOVar3;
}

Assistant:

typename Octree<PointT, ContainerT>::Octant* Octree<PointT, ContainerT>::createOctant(float x, float y, float z,
                                                                                      float extent, uint32_t startIdx,
                                                                                      uint32_t endIdx, uint32_t size)
{
  // For a leaf we don't have to change anything; points are already correctly linked or correctly reordered.
  Octant* octant = new Octant;

  octant->isLeaf = true;

  octant->x = x;
  octant->y = y;
  octant->z = z;
  octant->extent = extent;

  octant->start = startIdx;
  octant->end = endIdx;
  octant->size = size;

  static const float factor[] = {-0.5f, 0.5f};

  // subdivide subset of points and re-link points according to Morton codes
  if (size > params_.bucketSize && extent > 2 * params_.minExtent)
  {
    octant->isLeaf = false;

    const ContainerT& points = *data_;
    std::vector<uint32_t> childStarts(8, 0);
    std::vector<uint32_t> childEnds(8, 0);
    std::vector<uint32_t> childSizes(8, 0);

    // re-link disjoint child subsets...
    uint32_t idx = startIdx;

    for (uint32_t i = 0; i < size; ++i)
    {
      const PointT& p = points[idx];

      // determine Morton code for each point...
      uint32_t mortonCode = 0;
      if (get<0>(p) > x) mortonCode |= 1;
      if (get<1>(p) > y) mortonCode |= 2;
      if (get<2>(p) > z) mortonCode |= 4;

      // set child starts and update successors...
      if (childSizes[mortonCode] == 0)
        childStarts[mortonCode] = idx;
      else
        successors_[childEnds[mortonCode]] = idx;
      childSizes[mortonCode] += 1;

      childEnds[mortonCode] = idx;
      idx = successors_[idx];
    }

    // now, we can create the child nodes...
    float childExtent = 0.5f * extent;
    bool firsttime = true;
    uint32_t lastChildIdx = 0;
    for (uint32_t i = 0; i < 8; ++i)
    {
      if (childSizes[i] == 0) continue;

      float childX = x + factor[(i & 1) > 0] * extent;
      float childY = y + factor[(i & 2) > 0] * extent;
      float childZ = z + factor[(i & 4) > 0] * extent;

      octant->child[i] = createOctant(childX, childY, childZ, childExtent, childStarts[i], childEnds[i], childSizes[i]);

      if (firsttime)
        octant->start = octant->child[i]->start;
      else
        successors_[octant->child[lastChildIdx]->end] =
            octant->child[i]->start;  // we have to ensure that also the child ends link to the next child start.

      lastChildIdx = i;
      octant->end = octant->child[i]->end;
      firsttime = false;
    }
  }

  return octant;
}